

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

string * __thiscall base_uint<256u>::GetHex_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  base_blob<256U> b;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  lVar2 = 0x20;
  lVar1 = 0;
  do {
    local_5c = *(undefined4 *)((long)this + lVar1);
    __memcpy_chk((long)&local_58 + lVar1,&local_5c,4,lVar2);
    lVar1 = lVar1 + 4;
    lVar2 = lVar2 + -4;
  } while (lVar2 != 0);
  base_blob<256u>::GetHex_abi_cxx11_(__return_storage_ptr__,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string base_uint<BITS>::GetHex() const
{
    base_blob<BITS> b;
    for (int x = 0; x < this->WIDTH; ++x) {
        WriteLE32(b.begin() + x*4, this->pn[x]);
    }
    return b.GetHex();
}